

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall ON_FontMetrics::Dump(ON_FontMetrics *this,ON_TextLog *text_log)

{
  ON_TextLog::Print(text_log,"Units per EM = %d\n",(ulong)(uint)this->m_UPM);
  ON_TextLog::Print(text_log,"Ascent = %d\n",(ulong)(uint)this->m_ascent);
  ON_TextLog::Print(text_log,"Descent = %d\n",(ulong)(uint)this->m_descent);
  ON_TextLog::Print(text_log,"Distance between baselines = %d\n",(ulong)(uint)this->m_line_space);
  ON_TextLog::Print(text_log,"Ascent of capital = %d\n",(ulong)this->m_ascent_of_capital);
  ON_TextLog::Print(text_log,"Ascent of x = %d\n",(ulong)this->m_ascent_of_x);
  ON_TextLog::Print(text_log,"Strikeout thickness = %d\n",(ulong)(uint)this->m_strikeout_thickness);
  ON_TextLog::Print(text_log,"Strikeout position = %d\n",(ulong)(uint)this->m_strikeout_position);
  ON_TextLog::Print(text_log,"Underscore thickness = %d\n",(ulong)(uint)this->m_underscore_thickness
                   );
  ON_TextLog::Print(text_log,"Underscore position = %d\n",(ulong)(uint)this->m_underscore_position);
  return;
}

Assistant:

void ON_FontMetrics::Dump(class ON_TextLog& text_log) const
{
  text_log.Print("Units per EM = %d\n", m_UPM);
  text_log.Print("Ascent = %d\n", m_ascent);
  text_log.Print("Descent = %d\n", m_descent);
  text_log.Print("Distance between baselines = %d\n", m_line_space);
  text_log.Print("Ascent of capital = %d\n", AscentOfCapital());
  text_log.Print("Ascent of x = %d\n", AscentOfx());
  text_log.Print("Strikeout thickness = %d\n", m_strikeout_thickness);
  text_log.Print("Strikeout position = %d\n", m_strikeout_position);
  text_log.Print("Underscore thickness = %d\n", m_underscore_thickness);
  text_log.Print("Underscore position = %d\n", m_underscore_position);
}